

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int english_word_length_cdf_inv(double cdf)

{
  int x;
  double pdf_sum;
  double pdf_vec [27];
  int local_24;
  double dStack_20;
  int j;
  double cum;
  double cdf_local;
  
  memcpy(&pdf_sum,&DAT_0025f710,0xd8);
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    dStack_20 = 0.0;
    local_24 = 0;
    while( true ) {
      if (0x1a < local_24) {
        return 0x1b;
      }
      dStack_20 = dStack_20 + pdf_vec[(long)local_24 + -1];
      if (cdf <= dStack_20 / 0.99997) break;
      local_24 = local_24 + 1;
    }
    return local_24 + 1;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"ENGLISH_WORD_LENGTH_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

int english_word_length_cdf_inv ( double cdf )

//****************************************************************************80
//
//  Purpose:
//
//    ENGLISH_WORD_LENGTH_CDF_INV inverts the English Word Length CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    31 July 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Henry Kucera, Winthrop Francis,
//    Computational Analysis of Present-Day American English,
//    Brown University Press, 1967.
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Output, int ENGLISH_WORD_LENGTH_CDF_INV, the corresponding word
//    length for which CDF(X-1) < CDF <= CDF(X)
//
{
# define WORD_LENGTH_MAX 27

  double cum;
  int j;
  double pdf_vec[WORD_LENGTH_MAX] = {
    0.03160,
    0.16975,
    0.21192,
    0.15678,
    0.10852,
    0.08524,
    0.07724,
    0.05623,
    0.04032,
    0.02766,
    0.01582,
    0.00917,
    0.00483,
    0.00262,
    0.00099,
    0.00050,
    0.00027,
    0.00022,
    0.00011,
    0.00006,
    0.00005,
    0.00002,
    0.00001,
    0.00001,
    0.00001,
    0.00001,
    0.00001 };
  double pdf_sum = 0.99997;
  int x;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "ENGLISH_WORD_LENGTH_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  cum = 0.0;

  for ( j = 0; j < WORD_LENGTH_MAX; j++ )
  {
    cum = cum + pdf_vec[j];

    if ( cdf <= cum / pdf_sum )
    {
      x = j + 1;
      return x;
    }
  }

  x = WORD_LENGTH_MAX;

  return x;
# undef WORD_LENGTH_MAX
}